

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

uint32_t __thiscall
CompiledProjectOperator::evaluateExpr_
          (CompiledProjectOperator *this,DbVector **res,BatchResult *input)

{
  int32_t *piVar1;
  long lVar2;
  BatchResult *pBVar3;
  DbVector *pDVar4;
  uint local_d4;
  uint32_t i;
  int32_t *r;
  string local_c0;
  int32_t *local_a0;
  int32_t *tax;
  string local_90;
  int32_t *local_70;
  int32_t *discount;
  allocator<char> local_51;
  string local_50;
  int32_t *local_30;
  int32_t *extprice;
  BatchResult *pBStack_20;
  uint32_t n;
  BatchResult *input_local;
  DbVector **res_local;
  CompiledProjectOperator *this_local;
  
  pBStack_20 = input;
  input_local = (BatchResult *)res;
  res_local = (DbVector **)this;
  extprice._4_4_ = BatchResult::getn(input);
  pBVar3 = pBStack_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"extprice",&local_51);
  pDVar4 = BatchResult::getCol(pBVar3,&local_50);
  piVar1 = pDVar4->col;
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  pBVar3 = pBStack_20;
  local_30 = piVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"discount",(allocator<char> *)((long)&tax + 7));
  pDVar4 = BatchResult::getCol(pBVar3,&local_90);
  piVar1 = pDVar4->col;
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)((long)&tax + 7));
  pBVar3 = pBStack_20;
  local_70 = piVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"tax",(allocator<char> *)((long)&r + 7));
  pDVar4 = BatchResult::getCol(pBVar3,&local_c0);
  piVar1 = pDVar4->col;
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&r + 7));
  local_a0 = piVar1;
  pDVar4 = (DbVector *)operator_new(0x10);
  DbVector::DbVector(pDVar4,extprice._4_4_);
  *(DbVector **)&(input_local->data)._M_t._M_impl = pDVar4;
  lVar2 = *(long *)(*(long *)&(input_local->data)._M_t._M_impl + 8);
  for (local_d4 = 0; local_d4 < extprice._4_4_; local_d4 = local_d4 + 1) {
    *(int32_t *)(lVar2 + (ulong)local_d4 * 4) =
         local_30[local_d4] * (1 - local_70[local_d4]) * (local_a0[local_d4] + 1);
  }
  return extprice._4_4_;
}

Assistant:

uint32_t evaluateExpr_(DbVector** res, BatchResult* input) {
        uint32_t n = input->getn();
        int32_t *extprice = input->getCol("extprice")->col;
        int32_t *discount = input->getCol("discount")->col;
        int32_t *tax = input->getCol("tax")->col;

        *res = new DbVector(n);
        int32_t *r = (*res)->col;

        for (uint32_t i = 0; i < n; i++) {
            r[i] = extprice[i] * (1 - discount[i]) * (1 + tax[i]);
        }

        return n;
    }